

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ReusableStringStream * __thiscall
Catch::ReusableStringStream::operator<<(ReusableStringStream *this,char **value)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  
  poVar1 = (ostream *)this->m_oss;
  __s = *value;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  return this;
}

Assistant:

auto operator << ( T const& value ) -> ReusableStringStream& {
            *m_oss << value;
            return *this;
        }